

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall higan::TcpConnection::~TcpConnection(TcpConnection *this)

{
  LogLevel LVar1;
  Logger local_330;
  Fmt local_118;
  
  Channel::DisableAll(&this->channel_);
  if (this->connecting_ == true) {
    LVar1 = Logger::GetLogLevel();
    if ((int)LVar1 < 3) {
      Logger::Logger(&local_330,WARN,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpConnection.cpp"
                     ,0x1f,"~TcpConnection");
      Fmt::Fmt(&local_118,"connection: %s closed by destructor",
               (this->connection_name_)._M_dataplus._M_p);
      Logger::operator<<(&local_330,&local_118);
      Logger::~Logger(&local_330);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree(&(this->context_map_)._M_t);
  std::_Function_base::~_Function_base(&(this->write_over_callback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->new_connection_callback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->error_callback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->message_callback_).super__Function_base);
  Buffer::~Buffer(&this->output_buffer_);
  Buffer::~Buffer(&this->input_buffer_);
  Channel::~Channel(&this->channel_);
  Socket::~Socket(&this->socket_);
  std::__cxx11::string::~string((string *)&this->connection_name_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
              super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TcpConnection::~TcpConnection()
{
	channel_.DisableAll();

	if (connecting_)
	{
		LOG_WARN << higan::Fmt("connection: %s closed by destructor", connection_name_.c_str());
	}
}